

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench.cc
# Opt level: O0

void time_map_grow_predicted<EasyUseHashMap<HashObject<256,32>,int,HashFn>>(int iters)

{
  mapped_type *pmVar1;
  int in_EDI;
  size_t finish;
  double ut;
  int i;
  size_t start;
  Rusage t;
  EasyUseHashMap<HashObject<256,_32>,_int,_HashFn> set;
  undefined4 in_stack_fffffffffffffe68;
  int in_stack_fffffffffffffe6c;
  HashObject<256,_32> *in_stack_fffffffffffffe70;
  undefined4 in_stack_fffffffffffffe80;
  int in_stack_fffffffffffffe84;
  size_t in_stack_fffffffffffffef0;
  size_t in_stack_fffffffffffffef8;
  int in_stack_ffffffffffffff04;
  double in_stack_ffffffffffffff08;
  char *in_stack_ffffffffffffff10;
  undefined4 local_64;
  
  EasyUseHashMap<HashObject<256,_32>,_int,_HashFn>::EasyUseHashMap
            ((EasyUseHashMap<HashObject<256,_32>,_int,_HashFn> *)0x1e172b);
  Rusage::Rusage((Rusage *)in_stack_fffffffffffffe70);
  CurrentMemoryUsage();
  EasyUseHashMap<HashObject<256,_32>,_int,_HashFn>::resize
            ((EasyUseHashMap<HashObject<256,_32>,_int,_HashFn> *)in_stack_fffffffffffffe70,
             CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
  Rusage::Reset((Rusage *)in_stack_fffffffffffffe70);
  for (local_64 = 0; local_64 < in_EDI; local_64 = local_64 + 1) {
    in_stack_fffffffffffffe84 = local_64 + 1;
    HashObject<256,_32>::HashObject(in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c);
    pmVar1 = std::
             unordered_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
             ::operator[]((unordered_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
                           *)in_stack_fffffffffffffe70,
                          (key_type *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68))
    ;
    *pmVar1 = in_stack_fffffffffffffe84;
  }
  Rusage::UserTime((Rusage *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
  CurrentMemoryUsage();
  report(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,in_stack_ffffffffffffff04,
         in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
  EasyUseHashMap<HashObject<256,_32>,_int,_HashFn>::~EasyUseHashMap
            ((EasyUseHashMap<HashObject<256,_32>,_int,_HashFn> *)0x1e185b);
  return;
}

Assistant:

static void time_map_grow_predicted(int iters) {
  MapType set;
  Rusage t;

  const size_t start = CurrentMemoryUsage();
  set.resize(iters);
  t.Reset();
  for (int i = 0; i < iters; i++) {
    set[i] = i + 1;
  }
  double ut = t.UserTime();
  const size_t finish = CurrentMemoryUsage();
  report("map_predict/grow", ut, iters, start, finish);
}